

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageOperators.cpp
# Opt level: O0

unique_ptr<helics::Message,_std::default_delete<helics::Message>_> __thiscall
helics::CustomMessageOperator::process
          (CustomMessageOperator *this,
          unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *message)

{
  bool bVar1;
  unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *in_RDX;
  long in_RSI;
  tuple<helics::Message_*,_std::default_delete<helics::Message>_> in_RDI;
  unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *in_stack_ffffffffffffff98;
  unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *in_stack_ffffffffffffffa0;
  __uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_> this_00;
  
  this_00._M_t.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
  super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl =
       (tuple<helics::Message_*,_std::default_delete<helics::Message>_>)
       (tuple<helics::Message_*,_std::default_delete<helics::Message>_>)
       in_RDI.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
       super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
  bVar1 = std::function::operator_cast_to_bool
                    ((function<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_(std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>)>
                      *)0x421fd8);
  if (bVar1) {
    std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::unique_ptr
              ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)(in_RSI + 8),
               in_stack_ffffffffffffff98);
    std::
    function<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_(std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>)>
    ::operator()((function<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_(std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>)>
                  *)this_00._M_t.
                    super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                    .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl,in_RDX);
    std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr(in_RDX);
  }
  else {
    std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::unique_ptr
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
         (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
         in_RDI.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
         super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<Message> CustomMessageOperator::process(std::unique_ptr<Message> message)
{
    if (messageFunction) {
        return messageFunction(std::move(message));
    }
    return message;
}